

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

bool __thiscall
file_partial_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::read_file(file_partial_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file_contents)

{
  IResultCapture *pIVar1;
  AssertionHandler local_a0;
  undefined **local_58;
  undefined1 local_50;
  undefined1 local_4f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *local_40;
  undefined8 local_38;
  char *local_30;
  
  local_a0.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_a0.m_assertionInfo.macroName.m_size = 7;
  local_a0.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/tests/tests.cpp";
  local_a0.m_assertionInfo.lineInfo.line = 0x48e;
  local_a0.m_assertionInfo.capturedExpression.m_start = "name == \"what\"";
  local_a0.m_assertionInfo.capturedExpression.m_size = 0xe;
  local_a0.m_assertionInfo.resultDisposition = Normal;
  local_a0.m_reaction.shouldDebugBreak = false;
  local_a0.m_reaction.shouldThrow = false;
  local_a0.m_completed = false;
  pIVar1 = Catch::getResultCapture();
  local_a0.m_resultCapture = pIVar1;
  local_4f = std::operator==(name,"what");
  local_50 = 1;
  local_58 = &PTR_streamReconstructedExpression_0024e210;
  local_40 = "==";
  local_38 = 2;
  local_30 = "what";
  local_48 = name;
  (*pIVar1->_vptr_IResultCapture[10])(pIVar1,&local_a0,&local_58,&local_a0.m_reaction);
  Catch::AssertionHandler::complete(&local_a0);
  Catch::AssertionHandler::~AssertionHandler(&local_a0);
  std::__cxx11::string::assign((char *)file_contents);
  return true;
}

Assistant:

bool read_file(const string_type& name, string_type& file_contents) const {
        // read from file [name].mustache (fake the data for the test)
        REQUIRE(name == "what");
        file_contents = "World";
        return true;
    }